

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmdatasrc.h
# Opt level: O2

void __thiscall CVmMemorySourceList::CVmMemorySourceList(CVmMemorySourceList *this,long init_len)

{
  (this->super_CVmRefCntObj).cnt.cnt.super___atomic_base<long>._M_i = 1;
  (this->super_CVmRefCntObj)._vptr_CVmRefCntObj = (_func_int **)&PTR__CVmMemorySourceList_00343170;
  this->first_block_ = (CVmMemorySourceBlock *)0x0;
  this->last_block_ = (CVmMemorySourceBlock *)0x0;
  add_block(this);
  this->cur_block_ = this->first_block_;
  this->cur_block_ofs_ = 0;
  for (; 0x1000 < init_len; init_len = init_len + -0x1000) {
    add_block(this);
  }
  this->len_ = 0;
  return;
}

Assistant:

CVmMemorySourceList(long init_len)
    {
        /* no blocks yet */
        first_block_ = last_block_ = 0;

        /* always allocate at least the initial block */
        add_block();
        init_len -= BlockLen;

        /* set the seek position to the start of the first block */
        cur_block_ = first_block_;
        cur_block_ofs_ = 0;

        /* add more blocks until we've satisfied the length request */
        for ( ; init_len > 0 ; init_len -= BlockLen)
            add_block();

        /* the file is currently empty */
        len_ = 0;
    }